

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O0

void tokenize<std::vector<substring,std::allocator<substring>>>
               (char delim,substring s,vector<substring,_std::allocator<substring>_> *ret,
               bool allow_empty)

{
  value_type *in_RDX;
  value_type *in_RSI;
  char in_DIL;
  byte in_R8B;
  substring final_substring;
  substring temp;
  char *last;
  value_type *__x;
  vector<substring,_std::allocator<substring>_> *in_stack_ffffffffffffffb0;
  value_type *local_30;
  value_type *local_10;
  
  __x = in_RSI;
  std::vector<substring,_std::allocator<substring>_>::clear
            ((vector<substring,_std::allocator<substring>_> *)0x143443);
  local_30 = in_RSI;
  for (local_10 = in_RSI; local_10 != in_RDX; local_10 = (value_type *)((long)&local_10->begin + 1))
  {
    if (*(char *)&local_10->begin == in_DIL) {
      if (((in_R8B & 1) != 0) || (local_10 != local_30)) {
        std::vector<substring,_std::allocator<substring>_>::push_back(in_stack_ffffffffffffffb0,__x)
        ;
      }
      local_30 = (value_type *)((long)&local_10->begin + 1);
    }
  }
  if (((in_R8B & 1) != 0) || (local_10 != local_30)) {
    std::vector<substring,_std::allocator<substring>_>::push_back
              ((vector<substring,_std::allocator<substring>_> *)local_30,__x);
  }
  return;
}

Assistant:

void tokenize(char delim, substring s, ContainerT& ret, bool allow_empty = false)
{
  ret.clear();
  char* last = s.begin;
  for (; s.begin != s.end; s.begin++)
  {
    if (*s.begin == delim)
    {
      if (allow_empty || (s.begin != last))
      {
        substring temp = {last, s.begin};
        ret.push_back(temp);
      }
      last = s.begin + 1;
    }
  }
  if (allow_empty || (s.begin != last))
  {
    substring final_substring = {last, s.begin};
    ret.push_back(final_substring);
  }
}